

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

bool __thiscall QPushButton::event(QPushButton *this,QEvent *e)

{
  short sVar1;
  QPushButtonPrivate *this_00;
  bool bVar2;
  QDialog *pQVar3;
  
  this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  sVar1 = *(short *)(e + 8);
  if (sVar1 == 100) {
    QPushButtonPrivate::resetLayoutItemMargins(this_00);
  }
  else if (sVar1 != 0x4a) {
    if (sVar1 == 0x15) {
      pQVar3 = QPushButtonPrivate::dialogParent(this_00);
      if ((pQVar3 != (QDialog *)0x0) && ((this_00->field_0x2c8 & 4) != 0)) {
        QDialogPrivate::setMainDefault(*(QDialogPrivate **)&(pQVar3->super_QWidget).field_0x8,this);
      }
    }
    goto LAB_0043245b;
  }
  QWidget::updateGeometry((QWidget *)this);
LAB_0043245b:
  bVar2 = QAbstractButton::event(&this->super_QAbstractButton,e);
  return bVar2;
}

Assistant:

bool QPushButton::event(QEvent *e)
{
    Q_D(QPushButton);
    if (e->type() == QEvent::ParentChange) {
#if QT_CONFIG(dialog)
        if (QDialog *dialog = d->dialogParent()) {
            if (d->defaultButton)
                dialog->d_func()->setMainDefault(this);
        }
#endif
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->resetLayoutItemMargins();
        updateGeometry();
    } else if (e->type() == QEvent::PolishRequest) {
        updateGeometry();
    }
    return QAbstractButton::event(e);
}